

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

DDLNode * __thiscall ODDLParser::OpenDDLExportTest::createNodeHierarchy(OpenDDLExportTest *this)

{
  DDLNode *pDVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  DDLNode *local_80;
  DDLNode *node;
  uint32 i;
  allocator<char> local_39;
  string local_38;
  DDLNode *local_18;
  DDLNode *root;
  OpenDDLExportTest *this_local;
  
  root = (DDLNode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"test",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"root",(allocator<char> *)((long)&node + 7));
  pDVar1 = DDLNode::create(&local_38,(string *)&i,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&node + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pDVar1;
  for (node._0_4_ = 0; (uint)node < 10; node._0_4_ = (uint)node + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"test",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"child",&local_c9);
    pDVar1 = DDLNode::create(&local_a0,&local_c8,(DDLNode *)0x0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    local_80 = pDVar1;
    DDLNode::attachParent(pDVar1,local_18);
  }
  return local_18;
}

Assistant:

DDLNode *createNodeHierarchy() {
        DDLNode *root = DDLNode::create("test", "root");
        for (uint32 i = 0; i < 10; i++) {
            DDLNode *node(DDLNode::create("test", "child"));
            node->attachParent(root);
        }

        return root;
    }